

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

bool rcg::getBoolean(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,bool exception,
                    bool igncache)

{
  element_type *peVar1;
  undefined1 uVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  invalid_argument *piVar5;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [2];
  
  peVar1 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)local_78,name);
  iVar3 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,local_78);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_78);
  if (plVar4 == (long *)0x0) {
    if (exception) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_98,"Feature not found: ",&local_99);
      std::operator+(local_78,&local_98,name);
      std::invalid_argument::invalid_argument(piVar5,(string *)local_78);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    iVar3 = (*(code *)**(undefined8 **)((long)plVar4 + *(long *)(*plVar4 + -0x28)))
                      ((long)plVar4 + *(long *)(*plVar4 + -0x28));
    if (iVar3 - 3U < 2) {
      plVar4 = (long *)__dynamic_cast(plVar4,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IBoolean::typeinfo,0xfffffffffffffffe);
      if (plVar4 != (long *)0x0) {
        uVar2 = (**(code **)(*plVar4 + 0x48))(plVar4,0,igncache);
        return (bool)uVar2;
      }
      if (exception) {
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&local_98,"Feature not boolean: ",&local_99);
        std::operator+(local_78,&local_98,name);
        std::invalid_argument::invalid_argument(piVar5,(string *)local_78);
        __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    else if (exception) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_98,"Feature not readable: ",&local_99);
      std::operator+(local_78,&local_98,name);
      std::invalid_argument::invalid_argument(piVar5,(string *)local_78);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return false;
}

Assistant:

bool getBoolean(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                bool exception, bool igncache)
{
  bool ret=false;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        GenApi::IBoolean *val=dynamic_cast<GenApi::IBoolean *>(node);

        if (val != 0)
        {
          ret=val->GetValue(false, igncache);
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not boolean: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}